

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace_impl.cc
# Opt level: O1

bool __thiscall
webrtc::TraceImpl::UpdateFileName
          (TraceImpl *this,char *file_name_utf8,char *file_name_with_counter_utf8,uint32_t new_count
          )

{
  long lVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  
  sVar3 = strlen(file_name_utf8);
  uVar5 = (uint)sVar3;
  if (-1 < (int)uVar5) {
    uVar6 = 1;
    if ((int)uVar5 < 1) {
      uVar6 = uVar5;
    }
    uVar6 = uVar6 - 1;
    uVar8 = (ulong)(uVar5 & 0x7fffffff);
    do {
      if ((long)uVar8 < 2) goto LAB_0018f0f2;
      uVar4 = uVar8 - 1;
      lVar1 = uVar8 - 1;
      uVar8 = uVar4;
    } while (file_name_utf8[lVar1] != '.');
    uVar6 = (uint)uVar4;
LAB_0018f0f2:
    uVar8 = (ulong)uVar6;
    if (uVar6 == 0) {
      uVar8 = sVar3 & 0xffffffff;
    }
    iVar7 = (int)uVar8;
    iVar2 = 1;
    if (iVar7 < 1) {
      iVar2 = iVar7;
    }
    uVar4 = uVar8;
    do {
      uVar4 = uVar4 - 1;
      uVar6 = iVar2 - 1;
      if ((int)uVar8 < 2) break;
      uVar6 = (int)uVar8 - 1;
      uVar8 = (ulong)uVar6;
    } while (file_name_utf8[uVar4 & 0xffffffff] != '_');
    memcpy(file_name_with_counter_utf8,file_name_utf8,(long)(int)uVar6);
    sprintf(file_name_with_counter_utf8 + (int)uVar6,"_%lu%s",(ulong)new_count,
            file_name_utf8 + iVar7);
  }
  return -1 < (int)uVar5;
}

Assistant:

bool TraceImpl::UpdateFileName(
    const char file_name_utf8[FileWrapper::kMaxFileNameSize],
    char file_name_with_counter_utf8[FileWrapper::kMaxFileNameSize],
    const uint32_t new_count) const {
  int32_t length = (int32_t)strlen(file_name_utf8);
  if (length < 0) {
    return false;
  }

  int32_t length_without_file_ending = length - 1;
  while (length_without_file_ending > 0) {
    if (file_name_utf8[length_without_file_ending] == '.') {
      break;
    } else {
      length_without_file_ending--;
    }
  }
  if (length_without_file_ending == 0) {
    length_without_file_ending = length;
  }
  int32_t length_to_ = length_without_file_ending - 1;
  while (length_to_ > 0) {
    if (file_name_utf8[length_to_] == '_') {
      break;
    } else {
      length_to_--;
    }
  }

  memcpy(file_name_with_counter_utf8, file_name_utf8, length_to_);
  sprintf(file_name_with_counter_utf8 + length_to_, "_%lu%s",
          static_cast<long unsigned int>(new_count),
          file_name_utf8 + length_without_file_ending);
  return true;
}